

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderIndexingTests.cpp
# Opt level: O0

void deqp::gles2::Functional::evalSubscriptVec3(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  VecAccess<float,_4,_3> local_38;
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  pfVar3 = tcu::Vector<float,_4>::x(&c->coords);
  fVar1 = *pfVar3;
  pfVar3 = tcu::Vector<float,_4>::y(&local_10->coords);
  fVar2 = *pfVar3;
  pfVar3 = tcu::Vector<float,_4>::z(&local_10->coords);
  tcu::Vector<float,_3>::Vector(&local_1c,*pfVar3 * 0.25 + fVar2 * 0.5 + fVar1);
  tcu::Vector<float,_4>::xyz(&local_38,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_38,&local_1c);
  return;
}

Assistant:

void evalSubscriptVec3 (ShaderEvalContext& c) { c.color.xyz() = Vec3(c.coords.x() + 0.5f*c.coords.y() + 0.25f*c.coords.z()); }